

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_fxtype_params.cpp
# Opt level: O1

void __thiscall sc_dt::sc_fxtype_params::dump(sc_fxtype_params *this,ostream *os)

{
  char cVar1;
  long *plVar2;
  ostream *poVar3;
  sc_q_mode q_mode;
  sc_o_mode o_mode;
  string local_40;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"sc_fxtype_params",0x10);
  cVar1 = (char)os;
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"wl     = ",9);
  plVar2 = (long *)std::ostream::operator<<((ostream *)os,this->m_wl);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"iwl    = ",9);
  plVar2 = (long *)std::ostream::operator<<((ostream *)os,this->m_iwl);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"q_mode = ",9);
  sc_dt::to_string_abi_cxx11_(&local_40,(sc_dt *)(ulong)this->m_q_mode,q_mode);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"o_mode = ",9);
  sc_dt::to_string_abi_cxx11_(&local_40,(sc_dt *)(ulong)this->m_o_mode,o_mode);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"n_bits = ",9);
  plVar2 = (long *)std::ostream::operator<<((ostream *)os,this->m_n_bits);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void
sc_fxtype_params::dump( ::std::ostream& os ) const
{
    os << "sc_fxtype_params" << ::std::endl;
    os << "(" << ::std::endl;
    os << "wl     = " << m_wl << ::std::endl;
    os << "iwl    = " << m_iwl << ::std::endl;
    os << "q_mode = " << m_q_mode << ::std::endl;
    os << "o_mode = " << m_o_mode << ::std::endl;
    os << "n_bits = " << m_n_bits << ::std::endl;
    os << ")" << ::std::endl;
}